

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::SerializeInt(IMkvWriter *writer,int64 value,int32 size)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int32 status;
  uint8 b;
  int64 bb;
  int32 bit_count;
  int32 byte_count;
  int32 i;
  undefined1 local_31;
  long local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  undefined8 *local_10;
  int32 local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_EDX < 1)) || (8 < in_EDX)) {
    local_4 = -1;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_20 = 1; local_20 <= local_1c; local_20 = local_20 + 1) {
      local_24 = local_1c - local_20;
      local_28 = local_24 * 8;
      local_30 = local_18 >> ((byte)local_28 & 0x3f);
      local_31 = (undefined1)local_30;
      iVar1 = (**(code **)*local_10)(local_10,&local_31,1);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32 SerializeInt(IMkvWriter* writer, int64 value, int32 size) {
  if (!writer || size < 1 || size > 8)
    return -1;

  for (int32 i = 1; i <= size; ++i) {
    const int32 byte_count = size - i;
    const int32 bit_count = byte_count * 8;

    const int64 bb = value >> bit_count;
    const uint8 b = static_cast<uint8>(bb);

    const int32 status = writer->Write(&b, 1);

    if (status < 0)
      return status;
  }

  return 0;
}